

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

trt_node * trop_read_node(trt_node *__return_storage_ptr__,trt_parent_cache ca,trt_tree_ctx *tc)

{
  ly_bool lVar1;
  char *pcVar2;
  void *pvVar3;
  trt_type tVar4;
  trt_iffeatures tVar5;
  bool local_c9;
  char *local_c8;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  undefined8 local_90;
  undefined8 local_88;
  undefined4 local_80 [10];
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined1 local_38;
  lyplg_ext_sprinter_tree_node_override *local_30;
  lyplg_ext_sprinter_tree_node_override *no;
  lysp_node *pn;
  trt_tree_ctx *tc_local;
  trt_parent_cache ca_local;
  
  ca_local._0_8_ = ca.last_list;
  tc_local = ca._0_8_;
  pn = (lysp_node *)tc;
  if (((tc != (trt_tree_ctx *)0x0) && (tc->pn != (lysp_node *)0x0)) && (tc->pn->nodetype != 0)) {
    local_30 = tro_set_node_overr(tc->lysc_tree,tc->pn,'\x01',&tc->plugin_ctx);
    no = (lyplg_ext_sprinter_tree_node_override *)pn->name;
    local_90 = 0;
    local_88 = 0;
    memset(local_80,0,0x28);
    local_80[0] = 0;
    local_58 = 3;
    local_50 = 0;
    local_48 = 0;
    local_40 = 0;
    local_38 = 1;
    memcpy(__return_storage_ptr__,&local_90,0x60);
    pcVar2 = trop_resolve_status(*(uint16_t *)&no->add_opts,*(uint16_t *)((long)&no->add_opts + 2),
                                 tc_local._4_2_);
    __return_storage_ptr__->status = pcVar2;
    pcVar2 = trop_resolve_flags(*(uint16_t *)&no->add_opts,*(uint16_t *)((long)&no->add_opts + 2),
                                (trt_ancestor_type)tc_local,tc_local._6_2_,local_30);
    __return_storage_ptr__->flags = pcVar2;
    trop_resolve_node_opts
              ((lysp_node *)no,(lysp_node_list *)ca_local._0_8_,&(__return_storage_ptr__->name).type
               ,&(__return_storage_ptr__->name).opts);
    if ((local_30 == (lyplg_ext_sprinter_tree_node_override *)0x0) ||
       (local_30->add_opts == (char *)0x0)) {
      local_c8 = (char *)0x0;
    }
    else {
      local_c8 = local_30->add_opts;
    }
    (__return_storage_ptr__->name).add_opts = local_c8;
    local_c9 = false;
    if ((*(ushort *)(pn->name + 8) & 0x10) != 0) {
      lVar1 = trop_list_has_keys((lysp_node *)pn->name);
      local_c9 = lVar1 != '\0';
    }
    (__return_storage_ptr__->name).keys = local_c9;
    (__return_storage_ptr__->name).module_prefix = (char *)0x0;
    (__return_storage_ptr__->name).str = no[1].add_opts;
    tVar4 = trop_resolve_type((lysp_node *)no);
    *(ulong *)&__return_storage_ptr__->type = CONCAT44(uStack_9c,tVar4.type);
    (__return_storage_ptr__->type).str = tVar4.str;
    tVar5 = trop_resolve_iffeatures((lysp_node *)no);
    *(ulong *)&__return_storage_ptr__->iffeatures = CONCAT44(uStack_ac,tVar5.type);
    (__return_storage_ptr__->iffeatures).str = tVar5.str;
    pvVar3 = tro_next_sibling(no,(trt_tree_ctx *)pn);
    __return_storage_ptr__->last_one = (pvVar3 != (void *)0x0 ^ 0xffU) & 1;
    return __return_storage_ptr__;
  }
  __assert_fail("tc && tc->pn && tc->pn->nodetype != LYS_UNKNOWN",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0xb7b,
                "struct trt_node trop_read_node(struct trt_parent_cache, struct trt_tree_ctx *)");
}

Assistant:

static struct trt_node
trop_read_node(struct trt_parent_cache ca, struct trt_tree_ctx *tc)
{
    const struct lysp_node *pn;
    struct trt_node ret;
    struct lyplg_ext_sprinter_tree_node_override *no;

    assert(tc && tc->pn && tc->pn->nodetype != LYS_UNKNOWN);

    no = tro_set_node_overr(tc->lysc_tree, tc->pn, 1, &tc->plugin_ctx);

    pn = tc->pn;
    ret = TRP_EMPTY_NODE;

    /* <status> */
    ret.status = trop_resolve_status(pn->nodetype, pn->flags, ca.lys_status);

    /* <flags> */
    ret.flags = trop_resolve_flags(pn->nodetype, pn->flags, ca.ancestor, ca.lys_config, no);

    /* set type of the node */
    trop_resolve_node_opts(pn, ca.last_list, &ret.name.type, &ret.name.opts);
    ret.name.add_opts = no && no->add_opts ? no->add_opts : NULL;
    ret.name.keys = (tc->pn->nodetype & LYS_LIST) && trop_list_has_keys(tc->pn);

    /* The parsed tree is not compiled, so no node can be augmented
     * from another module. This means that nodes from the parsed tree
     * will never have the prefix.
     */
    ret.name.module_prefix = NULL;

    /* set node's name */
    ret.name.str = pn->name;

    /* <type> */
    ret.type = trop_resolve_type(pn);

    /* <iffeature> */
    ret.iffeatures = trop_resolve_iffeatures(pn);

    ret.last_one = !tro_next_sibling(pn, tc);

    return ret;
}